

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

HttpRanges * __thiscall
kj::tryParseHttpRangeHeader
          (HttpRanges *__return_storage_ptr__,kj *this,ArrayPtr<const_char> value,
          uint64_t contentLength)

{
  char *pcVar1;
  bool bVar2;
  NullableValue<kj::HttpByteRange> *other;
  HttpByteRange *pHVar3;
  char *pcVar4;
  size_t sVar5;
  Array<kj::HttpByteRange> local_c8;
  HttpUnsatisfiableRange local_ab;
  HttpEverythingRange local_aa;
  HttpUnsatisfiableRange local_a9;
  int local_a8;
  HttpUnsatisfiableRange local_a1;
  HttpByteRange *local_a0;
  HttpByteRange *range;
  Maybe<kj::HttpByteRange> local_88;
  undefined1 local_70 [8];
  NullableValue<kj::HttpByteRange> _range1246;
  Vector<kj::HttpByteRange> satisfiableRanges;
  bool fullRange;
  char *pcStack_30;
  char *p;
  uint64_t contentLength_local;
  ArrayPtr<const_char> value_local;
  
  p = (char *)value.size_;
  value_local.ptr = value.ptr;
  contentLength_local = (uint64_t)this;
  value_local.size_ = (size_t)__return_storage_ptr__;
  pcStack_30 = ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)&contentLength_local);
  bVar2 = anon_unknown_36::consumeByteRangeUnit(&stack0xffffffffffffffd0);
  if (bVar2) {
    if (*pcStack_30 == '=') {
      satisfiableRanges.builder.disposer._5_1_ = 0;
      pcStack_30 = pcStack_30 + 1;
      Vector<kj::HttpByteRange>::Vector
                ((Vector<kj::HttpByteRange> *)((long)&_range1246.field_1 + 8));
      pcVar4 = pcStack_30;
      do {
        pcStack_30 = pcVar4;
        anon_unknown_36::consumeRangeSpec(&local_88,&stack0xffffffffffffffd0,(uint64_t)p);
        other = _::readMaybe<kj::HttpByteRange>(&local_88);
        _::NullableValue<kj::HttpByteRange>::NullableValue
                  ((NullableValue<kj::HttpByteRange> *)local_70,other);
        Maybe<kj::HttpByteRange>::~Maybe(&local_88);
        pHVar3 = _::NullableValue::operator_cast_to_HttpByteRange_((NullableValue *)local_70);
        if (pHVar3 == (HttpByteRange *)0x0) {
          OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>::
          OneOf<kj::HttpUnsatisfiableRange,int>
                    ((OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>
                      *)__return_storage_ptr__,&local_a1);
          local_a8 = 1;
        }
        else {
          local_a0 = _::NullableValue<kj::HttpByteRange>::operator*
                               ((NullableValue<kj::HttpByteRange> *)local_70);
          if (((satisfiableRanges.builder.disposer._5_1_ & 1) == 0) &&
             (local_a0->start <= local_a0->end)) {
            if ((local_a0->start == 0) && ((char *)local_a0->end == p + -1)) {
              satisfiableRanges.builder.disposer._5_1_ = 1;
            }
            else {
              Vector<kj::HttpByteRange>::add<kj::HttpByteRange&>
                        ((Vector<kj::HttpByteRange> *)((long)&_range1246.field_1 + 8),local_a0);
            }
          }
          local_a8 = 0;
        }
        _::NullableValue<kj::HttpByteRange>::~NullableValue
                  ((NullableValue<kj::HttpByteRange> *)local_70);
        pcVar1 = pcStack_30;
        if (local_a8 != 0) goto LAB_007074ab;
        pcVar4 = pcStack_30 + 1;
      } while (*pcStack_30 == ',');
      pcVar4 = ArrayPtr<const_char>::end((ArrayPtr<const_char> *)&contentLength_local);
      if (pcVar1 == pcVar4) {
        if ((satisfiableRanges.builder.disposer._5_1_ & 1) == 0) {
          sVar5 = Vector<kj::HttpByteRange>::size
                            ((Vector<kj::HttpByteRange> *)((long)&_range1246.field_1 + 8));
          if (sVar5 == 0) {
            OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>::
            OneOf<kj::HttpUnsatisfiableRange,int>
                      ((OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>
                        *)__return_storage_ptr__,&local_ab);
            local_a8 = 1;
          }
          else {
            Vector<kj::HttpByteRange>::releaseAsArray
                      (&local_c8,(Vector<kj::HttpByteRange> *)((long)&_range1246.field_1 + 8));
            OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>::
            OneOf<kj::Array<kj::HttpByteRange>,int>
                      ((OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>
                        *)__return_storage_ptr__,&local_c8);
            Array<kj::HttpByteRange>::~Array(&local_c8);
            local_a8 = 1;
          }
        }
        else {
          OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>::
          OneOf<kj::HttpEverythingRange,int>
                    ((OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>
                      *)__return_storage_ptr__,&local_aa);
          local_a8 = 1;
        }
      }
      else {
        OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>::
        OneOf<kj::HttpUnsatisfiableRange,int>
                  ((OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>
                    *)__return_storage_ptr__,&local_a9);
        local_a8 = 1;
      }
LAB_007074ab:
      Vector<kj::HttpByteRange>::~Vector
                ((Vector<kj::HttpByteRange> *)((long)&_range1246.field_1 + 8));
    }
    else {
      pcStack_30 = pcStack_30 + 1;
      OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>::
      OneOf<kj::HttpUnsatisfiableRange,int>
                ((OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>
                  *)__return_storage_ptr__,
                 (HttpUnsatisfiableRange *)((long)&satisfiableRanges.builder.disposer + 6));
    }
  }
  else {
    OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>::
    OneOf<kj::HttpUnsatisfiableRange,int>
              ((OneOf<kj::Array<kj::HttpByteRange>,kj::HttpEverythingRange,kj::HttpUnsatisfiableRange>
                *)__return_storage_ptr__,
               (HttpUnsatisfiableRange *)((long)&satisfiableRanges.builder.disposer + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

HttpRanges tryParseHttpRangeHeader(kj::ArrayPtr<const char> value, uint64_t contentLength) {
  const char* p = value.begin();
  if (!consumeByteRangeUnit(p)) return HttpUnsatisfiableRange {};
  if (*(p++) != '=') return HttpUnsatisfiableRange {};

  auto fullRange = false;
  kj::Vector<HttpByteRange> satisfiableRanges;
  do {
    KJ_IF_SOME(range, consumeRangeSpec(p, contentLength)) {
      // Don't record more ranges if we've already recorded a full range
      if (!fullRange && range.start <= range.end) {
        if (range.start == 0 && range.end == contentLength - 1) {
          // A range evaluated to the full range, but still need to check rest are valid
          fullRange = true;
        } else {
          // "a valid bytes range-spec is satisfiable if it is either:
          // - an int-range with a first-pos that is less than the current length of the selected
          //   representation or
          // - a suffix-range with a non-zero suffix-length"
          satisfiableRanges.add(range);
        }
      }
    } else {
      // If we failed to parse a range, the whole range specification is invalid
      return HttpUnsatisfiableRange {};
    }
  } while (*(p++) == ',');

  if ((--p) != value.end()) return HttpUnsatisfiableRange {};
  if (fullRange) return HttpEverythingRange {};
  // "A valid ranges-specifier is "satisfiable" if it contains at least one range-spec that is
  // satisfiable"
  if (satisfiableRanges.size() == 0) return HttpUnsatisfiableRange {};
  return satisfiableRanges.releaseAsArray();
}